

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screenshot.hpp
# Opt level: O3

void __thiscall
Outputs::Display::OpenGL::Screenshot::Screenshot
          (Screenshot *this,int aspect_width,int aspect_height)

{
  pointer puVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  size_t __n;
  ulong uVar5;
  long lVar6;
  pointer __src;
  undefined8 uStack_80;
  undefined1 local_78 [8];
  GLint dimensions [4];
  undefined1 local_34 [8];
  int prior_alignment;
  
  (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glGetIntegerv(0xba2,local_78);
  this->height = dimensions[1];
  iVar3 = (aspect_width * dimensions[1]) / aspect_height;
  this->width = iVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->pixel_data,(long)(dimensions[1] * iVar3 * 4));
  glGetIntegerv(0xd05,local_34);
  glReadPixels(dimensions[0] - this->width >> 1,0,this->width,this->height,0x1908,0x1401,
               (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  glPixelStorei(0xd05);
  uVar4 = (ulong)(uint)this->height;
  if (1 < (uint)this->height) {
    __n = (size_t)(this->width << 2);
    dimensions._8_8_ = 0;
    lVar6 = 0;
    uVar5 = 0;
    do {
      lVar2 = -(__n + 0xf & 0xfffffffffffffff0);
      puVar1 = (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __src = puVar1 + ((long)((int)uVar4 + -1) + dimensions._8_8_) * __n;
      *(undefined8 *)((long)&uStack_80 + lVar2) = 0x458da2;
      memcpy(local_78 + lVar2,__src,__n);
      *(undefined8 *)((long)&uStack_80 + lVar2) = 0x458db7;
      memcpy(__src,puVar1 + lVar6,__n);
      puVar1 = (this->pixel_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)((long)&uStack_80 + lVar2) = 0x458dc9;
      memcpy(puVar1 + lVar6,local_78 + lVar2,__n);
      uVar5 = uVar5 + 1;
      uVar4 = (ulong)this->height;
      lVar6 = lVar6 + __n;
      dimensions._8_8_ = dimensions._8_8_ + -1;
    } while (uVar5 < uVar4 >> 1);
  }
  return;
}

Assistant:

Screenshot(int aspect_width, int aspect_height) {
		// Get the current viewport to establish framebuffer size. Then determine how wide the
		// centre portion of that would be, allowing for the requested aspect ratio.
		GLint dimensions[4];
		glGetIntegerv(GL_VIEWPORT, dimensions);

		height = int(dimensions[3]);
		width = (height * aspect_width) / aspect_height;
		pixel_data.resize(size_t(width * height * 4));

		// Grab the framebuffer contents, temporarily setting single-byte alignment.
		int prior_alignment;
		glGetIntegerv(GL_PACK_ALIGNMENT, &prior_alignment);
		glReadPixels((dimensions[2] - GLint(width)) >> 1, 0, GLint(width), GLint(height), GL_RGBA, GL_UNSIGNED_BYTE, pixel_data.data());
		glPixelStorei(GL_PACK_ALIGNMENT, prior_alignment);

		// Flip the contents into raster order.
		const size_t line_size = size_t(width * 4);
		for(size_t y = 0; y < size_t(height) / 2; ++y) {
			const size_t flipped_y = size_t(height - 1) - y;

			uint8_t temp[line_size];
			memcpy(temp, &pixel_data[flipped_y * line_size], line_size);
			memcpy(&pixel_data[flipped_y * line_size], &pixel_data[y * line_size], line_size);
			memcpy(&pixel_data[y * line_size], temp, line_size);
		}
	}